

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O3

void ZSTD_initDCtx_internal(ZSTD_DCtx *dctx)

{
  uint *puVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  
  dctx->staticSize = 0;
  dctx->dictEnd = (void *)0x0;
  dctx->ddictIsCold = 0;
  dctx->dictUses = ZSTD_dont_use;
  dctx->outBuffSize = 0;
  dctx->legacyContext = (void *)0x0;
  dctx->previousLegacyVersion = 0;
  dctx->noForwardProgress = 0;
  dctx->oversizedDuration = 0;
  puVar1 = (uint *)cpuid_basic_info(0);
  uVar3 = *puVar1;
  dctx->ddictLocal = (ZSTD_DDict *)0x0;
  dctx->ddict = (ZSTD_DDict *)0x0;
  *(undefined8 *)&dctx->streamStage = 0;
  *(undefined8 *)((long)&dctx->inBuff + 4) = 0;
  *(undefined4 *)((long)&dctx->inBuffSize + 4) = 0;
  uVar4 = 0;
  if ((uVar3 != 0) && (6 < uVar3)) {
    lVar2 = cpuid_Extended_Feature_Enumeration_info(7);
    uVar4 = *(uint *)(lVar2 + 4) >> 8 & 1;
  }
  dctx->bmi2 = uVar4;
  dctx->ddictSet = (ZSTD_DDictHashSet *)0x0;
  dctx->format = ZSTD_f_zstd1;
  dctx->forceIgnoreChecksum = ZSTD_d_validateChecksum;
  dctx->maxWindowSize = 0x8000001;
  dctx->outBufferMode = ZSTD_bm_buffered;
  dctx->refMultipleDDicts = ZSTD_rmd_refSingleDDict;
  return;
}

Assistant:

static void ZSTD_initDCtx_internal(ZSTD_DCtx* dctx)
{
    dctx->staticSize  = 0;
    dctx->ddict       = NULL;
    dctx->ddictLocal  = NULL;
    dctx->dictEnd     = NULL;
    dctx->ddictIsCold = 0;
    dctx->dictUses = ZSTD_dont_use;
    dctx->inBuff      = NULL;
    dctx->inBuffSize  = 0;
    dctx->outBuffSize = 0;
    dctx->streamStage = zdss_init;
    dctx->legacyContext = NULL;
    dctx->previousLegacyVersion = 0;
    dctx->noForwardProgress = 0;
    dctx->oversizedDuration = 0;
    dctx->bmi2 = ZSTD_cpuid_bmi2(ZSTD_cpuid());
    dctx->ddictSet = NULL;
    ZSTD_DCtx_resetParameters(dctx);
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
    dctx->dictContentEndForFuzzing = NULL;
#endif
}